

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int __thiscall
opengv::absolute_pose::modules::GpnpOptimizationFunctor::operator()
          (GpnpOptimizationFunctor *this,VectorXd *x,VectorXd *fvec)

{
  double dVar1;
  Matrix<double,_12,_1,_0,_12,_1> *pMVar2;
  size_t sVar3;
  pointer pMVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *pdVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  points_t ccam;
  long local_140;
  iterator iStack_138;
  Matrix<double,_3,_1,_0,_3,_1> *local_130;
  Matrix<double,_3,_1,_0,_3,_1> local_120;
  double adStack_108 [5];
  double local_e0;
  double dStack_d8;
  double dStack_d0;
  double dStack_c8;
  double dStack_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  
  pMVar2 = this->_a;
  adStack_108[1] =
       (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.
       array[0];
  adStack_108[2] =
       (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.
       array[1];
  adStack_108[3] =
       (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.
       array[2];
  adStack_108[4] =
       (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.m_data.
       array[3];
  local_e0 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
             m_data.array[4];
  dStack_d8 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[5];
  dStack_d0 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[6];
  dStack_c8 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[7];
  dStack_c0 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[8];
  dStack_b8 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[9];
  dStack_b0 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[10];
  dStack_a8 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).m_storage.
              m_data.array[0xb];
  sVar3 = this->_dim;
  if (sVar3 != 0) {
    pdVar7 = (double *)((long)this->_V + sVar3 * -0x60 + 0x4c0);
    sVar8 = 0;
    do {
      dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [sVar8];
      adStack_108[1] = adStack_108[1] + dVar1 * pdVar7[-8];
      adStack_108[2] = adStack_108[2] + dVar1 * pdVar7[-7];
      adStack_108[3] = adStack_108[3] + dVar1 * pdVar7[-6];
      adStack_108[4] = adStack_108[4] + dVar1 * pdVar7[-5];
      local_e0 = local_e0 + dVar1 * pdVar7[-4];
      dStack_d8 = dStack_d8 + dVar1 * pdVar7[-3];
      dStack_d0 = dStack_d0 + dVar1 * pdVar7[-2];
      dStack_c8 = dStack_c8 + dVar1 * pdVar7[-1];
      dStack_c0 = dStack_c0 + dVar1 * *pdVar7;
      dStack_b8 = dStack_b8 + dVar1 * pdVar7[1];
      dStack_b0 = dStack_b0 + dVar1 * pdVar7[2];
      dStack_a8 = dStack_a8 + dVar1 * pdVar7[3];
      sVar8 = sVar8 + 1;
      pdVar7 = pdVar7 + 0xc;
    } while (sVar3 != sVar8);
  }
  local_140 = 0;
  iStack_138._M_current = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_130 = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  lVar14 = 0x10;
  do {
    local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = *(double *)((long)adStack_108 + lVar14 + -8);
    local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = *(double *)((long)adStack_108 + lVar14);
    local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = *(double *)((long)adStack_108 + lVar14 + 8);
    if (iStack_138._M_current == local_130) {
      std::
      vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&local_140,iStack_138,&local_120);
    }
    else {
      ((iStack_138._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[2] =
           local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2];
      ((iStack_138._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[0] =
           local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      ((iStack_138._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
      m_storage.m_data.array[1] =
           local_120.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      iStack_138._M_current = iStack_138._M_current + 1;
    }
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x70);
  pdVar7 = (fvec->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pMVar4 = (this->_c->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = 0;
  lVar10 = 0;
  lVar14 = 0;
  do {
    lVar11 = lVar14 + 1;
    pauVar12 = (undefined1 (*) [16])(lVar14 * 0x18 + local_140);
    lVar13 = lVar9;
    do {
      auVar5 = vsubpd_avx(*(undefined1 (*) [16])
                           &pMVar4[lVar14].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data,*(undefined1 (*) [16])
                                    ((long)&pMVar4[1].
                                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                            .m_storage.m_data + lVar13));
      auVar6 = vsubpd_avx(*pauVar12,*(undefined1 (*) [16])(local_140 + 0x18 + lVar13));
      auVar16._8_8_ = 0;
      auVar16._0_8_ =
           *(double *)
            ((long)&pMVar4[lVar14].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data + 0x10);
      auVar16 = vmovhpd_avx(auVar16,*(undefined8 *)pauVar12[1]);
      auVar17._8_8_ = 0;
      auVar17._0_8_ =
           *(ulong *)((long)&pMVar4[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data + lVar13 + 0x10);
      auVar15 = vmovhpd_avx(auVar17,*(undefined8 *)(local_140 + 0x28 + lVar13));
      auVar16 = vsubpd_avx(auVar16,auVar15);
      auVar15._0_8_ =
           auVar5._0_8_ * auVar5._0_8_ + auVar5._8_8_ * auVar5._8_8_ + auVar16._0_8_ * auVar16._0_8_
      ;
      auVar15._8_8_ =
           auVar6._0_8_ * auVar6._0_8_ + auVar6._8_8_ * auVar6._8_8_ + auVar16._8_8_ * auVar16._8_8_
      ;
      auVar16 = vhsubpd_avx(auVar15,auVar15);
      dVar1 = (double)vmovlpd_avx(auVar16);
      pdVar7[lVar10] = dVar1;
      lVar10 = lVar10 + 1;
      lVar13 = lVar13 + 0x18;
    } while (lVar13 != 0x48);
    lVar9 = lVar9 + 0x18;
    lVar14 = lVar11;
  } while (lVar11 != 3);
  if (local_140 != 0) {
    free(*(void **)(local_140 + -8));
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == _dim );
    assert( (unsigned int) fvec.size() == 6);

    Eigen::Matrix<double,12,1> solution = _a;
    for(size_t i = 0; i < _dim; i++)
      solution += x[i]*_V.col(12-_dim+i);

    points_t ccam;
    for(size_t i = 0; i<4; i++)
      ccam.push_back(solution.block<3,1>(i*3,0));

    Eigen::Vector3d diffw;
    Eigen::Vector3d diffc;
    size_t index = 0;

    for(size_t i = 0; i<3; i++)
    {
      for(size_t j = i+1; j < 4; j++)
      {
        diffw = _c[i]-_c[j];
        diffc = ccam[i]-ccam[j];
        fvec[index++] = diffw.dot(diffw)-diffc.dot(diffc);
      }
    }

    return 0;
  }